

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  long lVar13;
  NodeRef nodeRef;
  ulong uVar14;
  RTCIntersectFunctionN p_Var15;
  NodeRef *pNVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  ulong uVar18;
  NodeRef *pNVar19;
  ulong uVar20;
  size_t sVar21;
  byte bVar22;
  size_t sVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  byte bVar27;
  size_t sVar28;
  bool bVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar68 [64];
  undefined8 extraout_XMM1_Qa;
  vint4 ai_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar83;
  vint4 ai_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vint4 bi_1;
  undefined1 auVar92 [16];
  vint4 bi_3;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  int in_XMM14_Da;
  int in_XMM14_Db;
  int in_XMM14_Dc;
  int in_XMM14_Dd;
  undefined1 auVar107 [64];
  vint4 bi_8;
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  float fVar2;
  float fVar3;
  float fVar4;
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar38 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      uVar32 = vpcmpeqd_avx512vl(auVar38,(undefined1  [16])valid_i->field_0);
      stack_node[0xa2].ptr = uVar32 & 0xf;
      if ((byte)stack_node[0xa2].ptr != 0) {
        stack_node[0x9e].ptr._0_4_ = (undefined4)stack_node[0xa2].ptr;
        stack_node[0xa1].ptr = (size_t)This->ptr;
        auVar41 = *(undefined1 (*) [16])ray;
        auVar107 = ZEXT1664(auVar41);
        auVar48 = *(undefined1 (*) [16])(ray + 0x10);
        auVar108 = ZEXT1664(auVar48);
        auVar40 = *(undefined1 (*) [16])(ray + 0x20);
        auVar109 = ZEXT1664(auVar40);
        auVar42 = *(undefined1 (*) [16])(ray + 0x40);
        auVar79._8_4_ = 0x7fffffff;
        auVar79._0_8_ = 0x7fffffff7fffffff;
        auVar79._12_4_ = 0x7fffffff;
        auVar43 = vandps_avx(auVar42,auVar79);
        auVar90._8_4_ = 0x219392ef;
        auVar90._0_8_ = 0x219392ef219392ef;
        auVar90._12_4_ = 0x219392ef;
        uVar32 = vcmpps_avx512vl(auVar43,auVar90,1);
        auVar43 = vblendmps_avx512vl(auVar42,auVar90);
        bVar30 = (bool)((byte)uVar32 & 1);
        auVar37._0_4_ = (uint)bVar30 * auVar43._0_4_ | (uint)!bVar30 * in_XMM14_Da;
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar30 * auVar43._4_4_ | (uint)!bVar30 * in_XMM14_Db;
        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar30 * auVar43._8_4_ | (uint)!bVar30 * in_XMM14_Dc;
        bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar30 * auVar43._12_4_ | (uint)!bVar30 * in_XMM14_Dd;
        auVar43 = *(undefined1 (*) [16])(ray + 0x50);
        auVar36 = vandps_avx(auVar43,auVar79);
        uVar32 = vcmpps_avx512vl(auVar36,auVar90,1);
        bVar30 = (bool)((byte)uVar32 & 1);
        auVar45._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._0_4_;
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._4_4_;
        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._8_4_;
        bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._12_4_;
        auVar43 = *(undefined1 (*) [16])(ray + 0x60);
        auVar36 = vandps_avx512vl(auVar43,auVar79);
        uVar32 = vcmpps_avx512vl(auVar36,auVar90,1);
        bVar30 = (bool)((byte)uVar32 & 1);
        auVar44._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._0_4_;
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._4_4_;
        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._8_4_;
        bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar43._12_4_;
        auVar36 = vrcp14ps_avx512vl(auVar37);
        auVar47 = ZEXT816(0) << 0x20;
        auVar105 = ZEXT864(0) << 0x20;
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = &DAT_3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        auVar103 = ZEXT1664(auVar86);
        auVar43 = vfnmadd213ps_fma(auVar37,auVar36,auVar86);
        auVar36 = vfmadd132ps_fma(auVar43,auVar36,auVar36);
        auVar111 = ZEXT1664(auVar36);
        auVar37 = vrcp14ps_avx512vl(auVar45);
        auVar43 = vfnmadd213ps_fma(auVar45,auVar37,auVar86);
        auVar37 = vfmadd132ps_fma(auVar43,auVar37,auVar37);
        auVar68 = ZEXT1664(auVar37);
        auVar43 = vrcp14ps_avx512vl(auVar44);
        auVar45 = vfnmadd213ps_avx512vl(auVar44,auVar43,auVar86);
        auVar45 = vfmadd132ps_avx512vl(auVar45,auVar43,auVar43);
        auVar110 = ZEXT1664(auVar45);
        auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar47);
        stack_node[0xb6].ptr = auVar43._0_8_;
        stack_node[0xb7].ptr = auVar43._8_8_;
        stack_node[0xa0].ptr = (size_t)(ray + 0x80);
        auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar47);
        stack_node[0xb4].ptr = auVar43._0_8_;
        stack_node[0xb5].ptr = auVar43._8_8_;
        auVar42 = vcmpps_avx(auVar42,auVar47,1);
        auVar43._8_4_ = 1;
        auVar43._0_8_ = 0x100000001;
        auVar43._12_4_ = 1;
        auVar43 = vandps_avx512vl(auVar42,auVar43);
        uVar32 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(ray + 0x50),0xe);
        auVar80._8_4_ = 2;
        auVar80._0_8_ = 0x200000002;
        auVar80._12_4_ = 2;
        auVar100 = ZEXT1664(auVar80);
        uVar33 = stack_node[0xa2].ptr ^ 0xf;
        auVar42 = vpsubd_avx512vl(auVar80,auVar42);
        bVar30 = (bool)((byte)uVar32 & 1);
        auVar46._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar43._0_4_;
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar43._4_4_;
        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar43._8_4_;
        bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar43._12_4_;
        uVar32 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(ray + 0x60),0xe);
        auVar42._8_4_ = 4;
        auVar42._0_8_ = 0x400000004;
        auVar42._12_4_ = 4;
        auVar42 = vpord_avx512vl(auVar46,auVar42);
        bVar30 = (bool)((byte)uVar32 & 1);
        auVar47._0_4_ = (uint)bVar30 * auVar42._0_4_ | !bVar30 * auVar46._0_4_;
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar30 * auVar42._4_4_ | !bVar30 * auVar46._4_4_;
        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar30 * auVar42._8_4_ | !bVar30 * auVar46._8_4_;
        bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar30 * auVar42._12_4_ | !bVar30 * auVar46._12_4_;
        auVar98 = ZEXT1664(auVar47);
        auVar42 = vmovdqa32_avx512vl(auVar47);
        bVar30 = (bool)((byte)stack_node[0xa2].ptr & 1);
        bVar29 = (bool)((byte)(stack_node[0xa2].ptr >> 1) & 1);
        bVar8 = (bool)((byte)(stack_node[0xa2].ptr >> 2) & 1);
        bVar7 = SUB81(stack_node[0xa2].ptr >> 3,0);
        stack_node[0xa8].ptr._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar38._0_4_;
        stack_node[0xa8].ptr._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar38._4_4_;
        stack_node[0xa9].ptr._0_4_ = (uint)bVar8 * auVar42._8_4_ | (uint)!bVar8 * auVar38._8_4_;
        stack_node[0xa9].ptr._4_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar38._12_4_;
        auVar96 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        stack_node[0xbc].ptr = auVar41._0_8_;
        stack_node[0xbd].ptr = auVar41._8_8_;
        auVar38._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
        auVar38._8_4_ = auVar41._8_4_ ^ 0x80000000;
        auVar38._12_4_ = auVar41._12_4_ ^ 0x80000000;
        auVar38 = vmulps_avx512vl(auVar36,auVar38);
        auVar112 = ZEXT1664(auVar38);
        stack_node[0xba].ptr = auVar48._0_8_;
        stack_node[0xbb].ptr = auVar48._8_8_;
        auVar41._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar41._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar41._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar41 = vmulps_avx512vl(auVar37,auVar41);
        auVar113 = ZEXT1664(auVar41);
        stack_node[0xb8].ptr = auVar40._0_8_;
        stack_node[0xb9].ptr = auVar40._8_8_;
        auVar48._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
        auVar48._8_4_ = auVar40._8_4_ ^ 0x80000000;
        auVar48._12_4_ = auVar40._12_4_ ^ 0x80000000;
        auVar48 = vmulps_avx512vl(auVar45,auVar48);
        auVar114 = ZEXT1664(auVar48);
        stack_node[200].ptr = auVar36._0_8_;
        stack_node[0xc9].ptr = auVar36._8_8_;
        stack_node[0xc6].ptr = auVar37._0_8_;
        stack_node[199].ptr = auVar37._8_8_;
        stack_node[0xc4].ptr = auVar45._0_8_;
        stack_node[0xc5].ptr = auVar45._8_8_;
        stack_node[0xc2].ptr = auVar38._0_8_;
        stack_node[0xc3].ptr = auVar38._8_8_;
        stack_node[0xc0].ptr = auVar41._0_8_;
        stack_node[0xc1].ptr = auVar41._8_8_;
        stack_node[0xbe].ptr = auVar48._0_8_;
        stack_node[0xbf].ptr = auVar48._8_8_;
        stack_node[0x9f].ptr = (size_t)ray;
        stack_node[0xa3].ptr = (size_t)context;
        do {
          lVar13 = 0;
          for (uVar32 = stack_node[0xa2].ptr; (uVar32 & 1) == 0;
              uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          iVar6 = *(int *)((long)&stack_node[0xa8].ptr + lVar13 * 4);
          auVar65._4_4_ = iVar6;
          auVar65._0_4_ = iVar6;
          auVar65._8_4_ = iVar6;
          auVar65._12_4_ = iVar6;
          auVar40._4_4_ = stack_node[0xa8].ptr._4_4_;
          auVar40._0_4_ = (uint)stack_node[0xa8].ptr;
          auVar40._8_4_ = (uint)stack_node[0xa9].ptr;
          auVar40._12_4_ = stack_node[0xa9].ptr._4_4_;
          uVar32 = vpcmpeqd_avx512vl(auVar65,auVar40);
          uVar32 = uVar32 & 0xf;
          bVar24 = (byte)uVar32;
          stack_node[0xed].ptr = CONCAT44((int)((ulong)lVar13 >> 0x20),(uint)bVar24);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar41 = vblendmps_avx512vl(auVar38,auVar111._0_16_);
          auVar36._0_4_ = (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * iVar6;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar36._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * iVar6;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar36._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * iVar6;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar36._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * iVar6;
          auVar41 = vblendmps_avx512vl(auVar38,auVar68._0_16_);
          auVar49._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar96._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar49._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar96._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar49._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar96._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar49._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar96._12_4_;
          auVar41 = vblendmps_avx512vl(auVar38,auVar110._0_16_);
          auVar50._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar98._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar50._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar98._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar50._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar98._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar50._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar98._12_4_;
          auVar102._8_4_ = 0xff800000;
          auVar102._0_8_ = 0xff800000ff800000;
          auVar102._12_4_ = 0xff800000;
          auVar41 = vblendmps_avx512vl(auVar102,auVar111._0_16_);
          auVar51._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar100._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar51._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar100._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar51._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar100._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar51._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar100._12_4_;
          auVar41 = vblendmps_avx512vl(auVar102,auVar68._0_16_);
          auVar52._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar103._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar52._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar103._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar52._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar103._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar52._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar103._12_4_;
          auVar41 = vblendmps_avx512vl(auVar102,auVar110._0_16_);
          auVar53._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar105._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar53._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar105._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar53._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar105._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar53._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar105._12_4_;
          auVar41 = vblendmps_avx512vl(auVar38,stack_node._1504_16_);
          auVar54._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar107._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar54._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar107._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar54._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar107._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar54._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar107._12_4_;
          auVar41 = vblendmps_avx512vl(auVar38,stack_node._1488_16_);
          auVar55._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar108._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar55._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar108._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar55._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar108._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar55._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar108._12_4_;
          auVar41 = vblendmps_avx512vl(auVar38,stack_node._1472_16_);
          auVar56._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar109._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * auVar109._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * auVar109._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar56._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * auVar109._12_4_;
          auVar41 = vblendmps_avx512vl(auVar102,stack_node._1504_16_);
          auVar57._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ |
               (uint)!(bool)(bVar24 & 1) * (int)stack_node[0xbc].ptr;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar57._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * stack_node[0xbc].ptr._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar57._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * (int)stack_node[0xbd].ptr;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar57._12_4_ =
               (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * stack_node[0xbd].ptr._4_4_;
          auVar41 = vblendmps_avx512vl(auVar102,stack_node._1488_16_);
          auVar58._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ |
               (uint)!(bool)(bVar24 & 1) * (int)stack_node[0xba].ptr;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * stack_node[0xba].ptr._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * (int)stack_node[0xbb].ptr;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar58._12_4_ =
               (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * stack_node[0xbb].ptr._4_4_;
          auVar41 = vblendmps_avx512vl(auVar102,stack_node._1472_16_);
          auVar59._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ |
               (uint)!(bool)(bVar24 & 1) * (int)stack_node[0xb8].ptr;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar59._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * stack_node[0xb8].ptr._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar59._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * (int)stack_node[0xb9].ptr;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar59._12_4_ =
               (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * stack_node[0xb9].ptr._4_4_;
          auVar41 = vblendmps_avx512vl(auVar102,stack_node._1440_16_);
          auVar60._0_4_ =
               (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * in_ZMM21._0_4_;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar30 * auVar41._4_4_ | (uint)!bVar30 * in_ZMM21._4_4_;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar30 * auVar41._8_4_ | (uint)!bVar30 * in_ZMM21._8_4_;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar60._12_4_ = (uint)bVar30 * auVar41._12_4_ | (uint)!bVar30 * in_ZMM21._12_4_;
          in_ZMM21 = ZEXT1664(auVar60);
          auVar38 = vblendmps_avx512vl(auVar38,stack_node._1456_16_);
          auVar61._0_4_ = (uint)(bVar24 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar24 & 1) * -0x800000
          ;
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar61._4_4_ = (uint)bVar30 * auVar38._4_4_ | (uint)!bVar30 * -0x800000;
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar61._8_4_ = (uint)bVar30 * auVar38._8_4_ | (uint)!bVar30 * -0x800000;
          bVar30 = SUB81(uVar32 >> 3,0);
          auVar61._12_4_ = (uint)bVar30 * auVar38._12_4_ | (uint)!bVar30 * -0x800000;
          auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
          auVar41 = vpblendmd_avx512vl(auVar38,stack_node._1456_16_);
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
          bVar8 = SUB81(uVar32 >> 3,0);
          auVar115 = ZEXT1664(CONCAT412((uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * auVar38._12_4_
                                        ,CONCAT48((uint)bVar29 * auVar41._8_4_ |
                                                  (uint)!bVar29 * auVar38._8_4_,
                                                  CONCAT44((uint)bVar30 * auVar41._4_4_ |
                                                           (uint)!bVar30 * auVar38._4_4_,
                                                           (uint)(bVar24 & 1) * auVar41._0_4_ |
                                                           (uint)!(bool)(bVar24 & 1) * auVar38._0_4_
                                                          ))));
          stack_node[0x9d].ptr._4_4_ = (uint)uVar32;
          stack_node[0xa2].ptr = ~stack_node[0xed].ptr & stack_node[0xa2].ptr;
          auVar38 = vshufps_avx(auVar36,auVar36,0xb1);
          auVar38 = vminps_avx(auVar38,auVar36);
          auVar41 = vshufpd_avx(auVar38,auVar38,1);
          auVar38 = vminps_avx(auVar41,auVar38);
          auVar41 = vshufps_avx(auVar49,auVar49,0xb1);
          auVar41 = vminps_avx(auVar41,auVar49);
          auVar48 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vminps_avx(auVar48,auVar41);
          auVar38 = vinsertps_avx(auVar38,auVar41,0x1c);
          auVar41 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar41 = vminps_avx(auVar41,auVar50);
          auVar48 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vminps_avx(auVar48,auVar41);
          auVar38 = vinsertps_avx(auVar38,auVar41,0x20);
          auVar41 = vshufps_avx(auVar51,auVar51,0xb1);
          auVar41 = vmaxps_avx(auVar41,auVar51);
          auVar48 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vmaxps_avx(auVar48,auVar41);
          auVar48 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar48 = vmaxps_avx(auVar48,auVar52);
          auVar40 = vshufpd_avx(auVar48,auVar48,1);
          auVar48 = vmaxps_avx(auVar40,auVar48);
          auVar41 = vinsertps_avx(auVar41,auVar48,0x1c);
          auVar48 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar48 = vmaxps_avx(auVar48,auVar53);
          auVar40 = vshufpd_avx(auVar48,auVar48,1);
          auVar48 = vmaxps_avx(auVar40,auVar48);
          auVar41 = vinsertps_avx(auVar41,auVar48,0x20);
          uVar32 = vcmpps_avx512vl(auVar38,ZEXT816(0) << 0x20,5);
          auVar48 = vblendmps_avx512vl(auVar41,auVar38);
          bVar24 = (byte)uVar32;
          fVar1 = (float)((uint)(bVar24 & 1) * auVar48._0_4_);
          fVar2 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar48._4_4_);
          auVar62._4_4_ = fVar2;
          auVar62._0_4_ = fVar1;
          fVar3 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar48._8_4_);
          auVar62._8_4_ = fVar3;
          fVar4 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar48._12_4_);
          auVar62._12_4_ = fVar4;
          auVar48 = vmovshdup_avx(auVar62);
          stack_node[0xa7].ptr = (ulong)(auVar48._0_4_ < 0.0) << 4 | 0x20;
          auVar48 = vshufpd_avx(auVar62,auVar62,1);
          uVar26 = (ulong)(auVar48._0_4_ < 0.0) << 4 | 0x40;
          stack_node[0xa6].ptr = stack_node[0xa7].ptr ^ 0x10;
          auVar48 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar48 = vminps_avx(auVar48,auVar54);
          auVar40 = vshufpd_avx(auVar48,auVar48,1);
          auVar48 = vminps_avx(auVar40,auVar48);
          auVar40 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar40 = vminps_avx(auVar40,auVar55);
          auVar42 = vshufpd_avx(auVar40,auVar40,1);
          auVar40 = vminps_avx(auVar42,auVar40);
          auVar48 = vinsertps_avx(auVar48,auVar40,0x1c);
          auVar40 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar40 = vminps_avx(auVar40,auVar56);
          auVar42 = vshufpd_avx(auVar40,auVar40,1);
          auVar40 = vminps_avx(auVar42,auVar40);
          auVar48 = vinsertps_avx(auVar48,auVar40,0x20);
          auVar40 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar40 = vmaxps_avx(auVar40,auVar57);
          auVar42 = vshufpd_avx(auVar40,auVar40,1);
          auVar40 = vmaxps_avx(auVar42,auVar40);
          auVar42 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar42 = vmaxps_avx(auVar42,auVar58);
          auVar43 = vshufpd_avx(auVar42,auVar42,1);
          auVar42 = vmaxps_avx(auVar43,auVar42);
          auVar40 = vinsertps_avx(auVar40,auVar42,0x1c);
          auVar42 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar42 = vmaxps_avx(auVar42,auVar59);
          auVar43 = vshufpd_avx(auVar42,auVar42,1);
          auVar42 = vmaxps_avx(auVar43,auVar42);
          auVar40 = vinsertps_avx(auVar40,auVar42,0x20);
          auVar36 = vblendmps_avx512vl(auVar40,auVar48);
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
          bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar43 = vshufps_avx512vl(auVar60,auVar60,0xb1);
          auVar37 = vmaxps_avx512vl(auVar43,auVar60);
          auVar103 = ZEXT1664(auVar37);
          auVar43 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar43 = vminps_avx(auVar43,auVar61);
          auVar107 = ZEXT1664(auVar43);
          auVar63._0_4_ =
               (float)((uint)(bVar24 & 1) * auVar41._0_4_ |
                      (uint)!(bool)(bVar24 & 1) * auVar38._0_4_);
          bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar63._4_4_ = (float)((uint)bVar8 * auVar41._4_4_ | (uint)!bVar8 * auVar38._4_4_);
          bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar63._8_4_ = (float)((uint)bVar8 * auVar41._8_4_ | (uint)!bVar8 * auVar38._8_4_);
          bVar8 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar63._12_4_ = (float)((uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * auVar38._12_4_);
          auVar76._0_4_ =
               (float)((uint)(bVar24 & 1) * auVar40._0_4_ |
                      (uint)!(bool)(bVar24 & 1) * auVar48._0_4_) * fVar1;
          auVar76._4_4_ =
               (float)((uint)bVar29 * auVar40._4_4_ | (uint)!bVar29 * auVar48._4_4_) * fVar2;
          auVar76._8_4_ =
               (float)((uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar48._8_4_) * fVar3;
          auVar76._12_4_ =
               (float)((uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar48._12_4_) * fVar4;
          auVar81._0_4_ =
               (float)((uint)(bVar24 & 1) * auVar36._0_4_ |
                      (uint)!(bool)(bVar24 & 1) * auVar42._0_4_) * auVar63._0_4_;
          auVar81._4_4_ =
               (float)((uint)bVar30 * auVar36._4_4_ | (uint)!bVar30 * auVar42._4_4_) * auVar63._4_4_
          ;
          auVar81._8_4_ =
               (float)((uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar42._8_4_) * auVar63._8_4_;
          auVar81._12_4_ =
               (float)((uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar42._12_4_) *
               auVar63._12_4_;
          auVar100 = ZEXT1664(auVar81);
          uVar18 = (ulong)(fVar1 < 0.0) * 0x10;
          stack_node[0xec].ptr = *(size_t *)(stack_node[0xa1].ptr + 0x70);
          auVar109 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
          auVar94._8_4_ = 0x80000000;
          auVar94._0_8_ = 0x8000000080000000;
          auVar94._12_4_ = 0x80000000;
          auVar108 = ZEXT1664(auVar94);
          uVar32 = CONCAT44(auVar76._0_4_,auVar76._0_4_);
          auVar97 = ZEXT1664(CONCAT412(-auVar76._0_4_,
                                       CONCAT48(-auVar76._0_4_,uVar32 ^ 0x8000000080000000)));
          auVar38 = vshufps_avx(auVar62,auVar62,0x55);
          auVar99 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx(auVar76,auVar76,0x55);
          auVar105 = ZEXT1664(auVar38);
          auVar101 = ZEXT1664(CONCAT412(auVar38._12_4_ ^ 0x80000000,
                                        CONCAT48(auVar38._8_4_ ^ 0x80000000,
                                                 auVar38._0_8_ ^ 0x8000000080000000)));
          auVar38 = vshufps_avx(auVar62,auVar62,0xaa);
          auVar104 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx(auVar76,auVar76,0xaa);
          auVar106 = ZEXT1664(CONCAT412(auVar38._12_4_ ^ 0x80000000,
                                        CONCAT48(auVar38._8_4_ ^ 0x80000000,
                                                 auVar38._0_8_ ^ 0x8000000080000000)));
          auVar38 = vbroadcastss_avx512vl(auVar63);
          auVar116 = ZEXT1664(auVar38);
          auVar70._4_4_ = auVar81._0_4_;
          auVar70._0_4_ = auVar81._0_4_;
          auVar70._8_4_ = auVar81._0_4_;
          auVar70._12_4_ = auVar81._0_4_;
          auVar38 = vxorps_avx512vl(auVar70,auVar94);
          auVar117 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx512vl(auVar63,auVar63,0x55);
          auVar118 = ZEXT1664(auVar38);
          uVar83 = auVar43._0_4_;
          auVar71._4_4_ = uVar83;
          auVar71._0_4_ = uVar83;
          auVar71._8_4_ = uVar83;
          auVar71._12_4_ = uVar83;
          auVar38 = vshufps_avx(auVar43,auVar43,0xaa);
          auVar38 = vminps_avx512vl(auVar38,auVar71);
          auVar119 = ZEXT1664(auVar38);
          uVar83 = auVar37._0_4_;
          auVar72._4_4_ = uVar83;
          auVar72._0_4_ = uVar83;
          auVar72._8_4_ = uVar83;
          auVar72._12_4_ = uVar83;
          auVar38 = vshufps_avx(auVar37,auVar37,0xaa);
          auVar98 = ZEXT1664(auVar38);
          auVar38 = vmaxps_avx512vl(auVar38,auVar72);
          auVar120 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx(auVar81,auVar81,0x55);
          auVar96 = ZEXT1664(auVar38);
          auVar38 = vxorps_avx512vl(auVar38,auVar94);
          auVar121 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx512vl(auVar63,auVar63,0xaa);
          auVar122 = ZEXT1664(auVar38);
          auVar38 = vshufps_avx(auVar81,auVar81,0xaa);
          auVar38 = vxorps_avx512vl(auVar38,auVar94);
          auVar123 = ZEXT1664(auVar38);
          pNVar19 = stack_node + 0xee;
          do {
            if (pNVar19 == stack_node + 0xec) break;
            pNVar16 = pNVar19 + -2;
            uVar32 = ~(uVar33 & 0xff) & pNVar19[-1].ptr;
            if (uVar32 != 0) {
              sVar28 = pNVar16->ptr;
LAB_0078ec61:
              auVar38 = auVar109._0_16_;
              auVar41 = auVar97._0_16_;
              auVar48 = auVar99._0_16_;
              auVar40 = auVar101._0_16_;
              auVar42 = auVar104._0_16_;
              auVar43 = auVar106._0_16_;
              auVar46 = auVar119._0_16_;
              auVar37 = auVar116._0_16_;
              auVar45 = auVar117._0_16_;
              auVar44 = auVar118._0_16_;
              auVar79 = auVar121._0_16_;
              auVar80 = auVar122._0_16_;
              auVar86 = auVar123._0_16_;
              auVar47 = auVar120._0_16_;
              auVar36 = in_ZMM21._0_16_;
              if ((sVar28 & 8) == 0) goto code_r0x0078ec6b;
              if (uVar32 != 0) {
                stack_node[0x9e].ptr._4_4_ = (uint)uVar33;
                bVar24 = (byte)uVar33 & 0xf;
                stack_node[0xa4].ptr = (ulong)((uint)sVar28 & 0xf) - 8;
                if (stack_node[0xa4].ptr != 0) {
                  stack_node[0x9d].ptr._3_1_ = bVar24 ^ 0xf;
                  sVar21 = 1;
                  stack_node[0xe8].ptr = auVar36._0_8_;
                  stack_node[0xe9].ptr = auVar36._8_8_;
                  auVar36 = vmovdqa64_avx512vl(auVar115._0_16_);
                  stack_node[0xe6].ptr = auVar36._0_8_;
                  stack_node[0xe7].ptr = auVar36._8_8_;
                  stack_node[0xe4].ptr = auVar38._0_8_;
                  stack_node[0xe5].ptr = auVar38._8_8_;
                  stack_node[0xe2].ptr = auVar41._0_8_;
                  stack_node[0xe3].ptr = auVar41._8_8_;
                  stack_node[0xe0].ptr = auVar48._0_8_;
                  stack_node[0xe1].ptr = auVar48._8_8_;
                  stack_node[0xde].ptr = auVar40._0_8_;
                  stack_node[0xdf].ptr = auVar40._8_8_;
                  stack_node[0xdc].ptr = auVar42._0_8_;
                  stack_node[0xdd].ptr = auVar42._8_8_;
                  stack_node[0xda].ptr = auVar43._0_8_;
                  stack_node[0xdb].ptr = auVar43._8_8_;
                  stack_node[0xd8].ptr = auVar37._0_8_;
                  stack_node[0xd9].ptr = auVar37._8_8_;
                  stack_node[0xd6].ptr = auVar45._0_8_;
                  stack_node[0xd7].ptr = auVar45._8_8_;
                  stack_node[0xd4].ptr = auVar44._0_8_;
                  stack_node[0xd5].ptr = auVar44._8_8_;
                  stack_node[0xd2].ptr = auVar46._0_8_;
                  stack_node[0xd3].ptr = auVar46._8_8_;
                  stack_node[0xd0].ptr = auVar47._0_8_;
                  stack_node[0xd1].ptr = auVar47._8_8_;
                  stack_node[0xce].ptr = auVar79._0_8_;
                  stack_node[0xcf].ptr = auVar79._8_8_;
                  stack_node[0xcc].ptr = auVar80._0_8_;
                  stack_node[0xcd].ptr = auVar80._8_8_;
                  stack_node[0xca].ptr = auVar86._0_8_;
                  stack_node[0xcb].ptr = auVar86._8_8_;
                  do {
                    stack_node[0xb0].ptr._4_4_ =
                         *(uint *)(((sVar28 & 0xfffffffffffffff0) - 8) + sVar21 * 8);
                    stack_node[0xb1].ptr =
                         (size_t)(context->scene->geometries).items[stack_node[0xb0].ptr._4_4_].ptr;
                    uVar5 = ((Geometry *)stack_node[0xb1].ptr)->mask;
                    auVar67._4_4_ = uVar5;
                    auVar67._0_4_ = uVar5;
                    auVar67._8_4_ = uVar5;
                    auVar67._12_4_ = uVar5;
                    uVar12 = vptestmd_avx512vl(auVar67,*(undefined1 (*) [16])
                                                        (stack_node[0x9f].ptr + 0x90));
                    bVar24 = (byte)uVar12 & 0xf & stack_node[0x9d].ptr._3_1_;
                    stack_node[0xa5].ptr = sVar21;
                    if (bVar24 == 0) {
                      bVar24 = 0xf;
                    }
                    else {
                      stack_node[0xad].ptr._0_4_ =
                           *(undefined4 *)(((sVar28 & 0xfffffffffffffff0) - 4) + sVar21 * 8);
                      stack_node._1872_16_ = vpmovm2d_avx512vl((ulong)bVar24);
                      stack_node[0xab].ptr = (size_t)(stack_node + 0xea);
                      stack_node[0xac].ptr = (size_t)((Geometry *)stack_node[0xb1].ptr)->userPtr;
                      stack_node[0xae].ptr = (size_t)context->user;
                      stack_node[0xaf] = stack_node[0x9f];
                      stack_node[0xb0].ptr._0_4_ = 4;
                      stack_node[0xb2].ptr = 0;
                      stack_node[0xb3].ptr = (size_t)context->args;
                      p_Var15 = ((RTCIntersectArguments *)stack_node[0xb3].ptr)->intersect;
                      if (p_Var15 == (RTCIntersectFunctionN)0x0) {
                        p_Var15 = (RTCIntersectFunctionN)
                                  (((Geometry *)(stack_node[0xb1].ptr + 0x60))->super_RefCount).
                                  refCounter.super___atomic_base<unsigned_long>._M_i;
                      }
                      stack_node[0x9b].ptr = 0x78ef71;
                      (*p_Var15)((RTCIntersectFunctionNArguments *)(stack_node + 0xab));
                      auVar96._8_56_ = extraout_var;
                      auVar96._0_8_ = extraout_XMM1_Qa;
                      uVar12 = vcmpps_avx512vl((undefined1  [16])0x0,
                                               *(undefined1 (*) [16])(stack_node[0x9f].ptr + 0x80),
                                               0xe);
                      bVar24 = (byte)uVar12 ^ 0xf;
                      auVar111 = ZEXT1664(stack_node._1600_16_);
                      auVar68 = ZEXT1664(stack_node._1584_16_);
                      auVar110 = ZEXT1664(stack_node._1568_16_);
                      uVar33 = (ulong)stack_node[0x9e].ptr._4_4_;
                      auVar112 = ZEXT1664(stack_node._1552_16_);
                      auVar113 = ZEXT1664(stack_node._1536_16_);
                      auVar114 = ZEXT1664(stack_node._1520_16_);
                      in_ZMM21 = ZEXT1664(stack_node._1856_16_);
                      auVar38 = vmovdqa64_avx512vl(stack_node._1840_16_);
                      auVar115 = ZEXT1664(auVar38);
                      auVar109 = ZEXT1664(stack_node._1824_16_);
                      auVar97 = ZEXT1664(stack_node._1808_16_);
                      auVar99 = ZEXT1664(stack_node._1792_16_);
                      auVar101 = ZEXT1664(stack_node._1776_16_);
                      auVar104 = ZEXT1664(stack_node._1760_16_);
                      auVar106 = ZEXT1664(stack_node._1744_16_);
                      auVar116 = ZEXT1664(stack_node._1728_16_);
                      auVar117 = ZEXT1664(stack_node._1712_16_);
                      auVar118 = ZEXT1664(stack_node._1696_16_);
                      auVar119 = ZEXT1664(stack_node._1680_16_);
                      auVar120 = ZEXT1664(stack_node._1664_16_);
                      auVar121 = ZEXT1664(stack_node._1648_16_);
                      auVar122 = ZEXT1664(stack_node._1632_16_);
                      auVar123 = ZEXT1664(stack_node._1616_16_);
                      context = (RayQueryContext *)stack_node[0xa3];
                    }
                    stack_node[0x9d].ptr._3_1_ = stack_node[0x9d].ptr._3_1_ & bVar24;
                  } while ((stack_node[0x9d].ptr._3_1_ != 0) &&
                          (sVar21 = stack_node[0xa5].ptr + 1,
                          stack_node[0xa5].ptr < stack_node[0xa4].ptr));
                  bVar24 = stack_node[0x9d].ptr._3_1_ ^ 0xf;
                }
                bVar24 = (byte)uVar33 | bVar24;
                uVar33 = CONCAT71((int7)(uVar33 >> 8),bVar24);
                bVar25 = (byte)stack_node[0x9d].ptr._4_4_ & ~bVar24;
                stack_node[0x9d].ptr._4_4_ =
                     CONCAT31((int3)(stack_node[0x9d].ptr._4_4_ >> 8),bVar25) & 0xffffff0f;
                if ((bVar25 & 0xf) != 0) {
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
                  bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
                  bVar8 = (bool)((byte)(uVar33 >> 3) & 1);
                  in_ZMM21 = ZEXT1664(CONCAT412((uint)bVar8 * auVar38._12_4_ |
                                                (uint)!bVar8 * in_ZMM21._12_4_,
                                                CONCAT48((uint)bVar29 * auVar38._8_4_ |
                                                         (uint)!bVar29 * in_ZMM21._8_4_,
                                                         CONCAT44((uint)bVar30 * auVar38._4_4_ |
                                                                  (uint)!bVar30 * in_ZMM21._4_4_,
                                                                  (uint)(bVar24 & 1) * auVar38._0_4_
                                                                  | (uint)!(bool)(bVar24 & 1) *
                                                                    in_ZMM21._0_4_))));
                  goto LAB_0078f0af;
                }
                bVar30 = true;
                goto LAB_0078f0b1;
              }
            }
LAB_0078f0af:
            bVar30 = false;
LAB_0078f0b1:
            pNVar19 = pNVar16;
          } while (!bVar30);
        } while (stack_node[0xa2].ptr != 0);
        bVar24 = (byte)uVar33 & (byte)stack_node[0x9e].ptr;
        bVar30 = (bool)(bVar24 >> 1 & 1);
        bVar29 = (bool)(bVar24 >> 2 & 1);
        bVar8 = (bool)(bVar24 >> 3 & 1);
        *(uint *)stack_node[0xa0].ptr =
             (uint)(bVar24 & 1) * -0x800000 |
             (uint)!(bool)(bVar24 & 1) * *(int *)stack_node[0xa0].ptr;
        *(uint *)(stack_node[0xa0].ptr + 4) =
             (uint)bVar30 * -0x800000 | (uint)!bVar30 * *(int *)(stack_node[0xa0].ptr + 4);
        *(uint *)(stack_node[0xa0].ptr + 8) =
             (uint)bVar29 * -0x800000 | (uint)!bVar29 * *(int *)(stack_node[0xa0].ptr + 8);
        *(uint *)(stack_node[0xa0].ptr + 0xc) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(stack_node[0xa0].ptr + 0xc);
      }
      return;
    }
    auVar38 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    auVar41 = ZEXT816(0) << 0x40;
    uVar12 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar41,5);
    uVar32 = vpcmpeqd_avx512vl(auVar38,(undefined1  [16])valid_i->field_0);
    uVar32 = ((byte)uVar12 & 0xf) & uVar32;
    bVar24 = (byte)uVar32;
    if (bVar24 != 0) {
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar48 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx(auVar38,auVar74);
      auVar84._8_4_ = 0x219392ef;
      auVar84._0_8_ = 0x219392ef219392ef;
      auVar84._12_4_ = 0x219392ef;
      uVar33 = vcmpps_avx512vl(auVar42,auVar84,1);
      bVar30 = (bool)((byte)uVar33 & 1);
      auVar34._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar38._0_4_;
      bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar38._4_4_;
      bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar38._8_4_;
      bVar30 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar38._12_4_;
      auVar38 = vandps_avx(auVar40,auVar74);
      uVar33 = vcmpps_avx512vl(auVar38,auVar84,1);
      bVar30 = (bool)((byte)uVar33 & 1);
      auVar35._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar40._0_4_;
      bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar40._4_4_;
      bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar40._8_4_;
      bVar30 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar40._12_4_;
      auVar36 = vrcp14ps_avx512vl(auVar34);
      auVar88._8_4_ = 0x3f800000;
      auVar88._0_8_ = &DAT_3f8000003f800000;
      auVar88._12_4_ = 0x3f800000;
      auVar42 = vfnmadd213ps_fma(auVar34,auVar36,auVar88);
      auVar37 = vrcp14ps_avx512vl(auVar35);
      auVar43 = vfnmadd213ps_fma(auVar35,auVar37,auVar88);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar105 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar24 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar30 * auVar38._4_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar30 * auVar38._8_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = SUB81(uVar32 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar30 * auVar38._12_4_ | (uint)!bVar30 * 0x7f800000;
      auVar107 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar38 = *(undefined1 (*) [16])ray;
      auVar40 = *(undefined1 (*) [16])(ray + 0x10);
      auVar95._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar95._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar95._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar40 = *(undefined1 (*) [16])(ray + 0x20);
      auVar69._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar69._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar69._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar40 = vandps_avx(auVar48,auVar74);
      uVar33 = vcmpps_avx512vl(auVar40,auVar84,1);
      bVar30 = (bool)((byte)uVar33 & 1);
      auVar39._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._0_4_;
      bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._4_4_;
      bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._8_4_;
      bVar30 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._12_4_;
      auVar40 = vrcp14ps_avx512vl(auVar39);
      auVar48 = vfnmadd213ps_fma(auVar39,auVar40,auVar88);
      auVar48 = vfmadd132ps_fma(auVar48,auVar40,auVar40);
      auVar100 = ZEXT1664(auVar48);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar41);
      bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
      bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
      bVar8 = SUB81(uVar32 >> 3,0);
      auVar108 = ZEXT1664(CONCAT412((uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * -0x800000,
                                    CONCAT48((uint)bVar29 * auVar41._8_4_ |
                                             (uint)!bVar29 * -0x800000,
                                             CONCAT44((uint)bVar30 * auVar41._4_4_ |
                                                      (uint)!bVar30 * -0x800000,
                                                      (uint)(bVar24 & 1) * auVar41._0_4_ |
                                                      (uint)!(bool)(bVar24 & 1) * -0x800000))));
      auVar41 = vfmadd132ps_fma(auVar42,auVar36,auVar36);
      auVar98 = ZEXT1664(auVar41);
      auVar40 = vfmadd132ps_fma(auVar43,auVar37,auVar37);
      auVar103 = ZEXT1664(auVar40);
      bVar25 = (byte)((ushort)((short)uVar32 << 0xc) >> 0xc) ^ 0xf;
      pNVar19 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar17 = &stack_near[2].field_0;
      auVar96 = ZEXT1664(CONCAT412(auVar41._12_4_ * -auVar38._12_4_,
                                   CONCAT48(auVar41._8_4_ * -auVar38._8_4_,
                                            CONCAT44(auVar41._4_4_ * -auVar38._4_4_,
                                                     auVar41._0_4_ * -auVar38._0_4_))));
      auVar38 = vmulps_avx512vl(auVar48,auVar95);
      auVar109 = ZEXT1664(auVar38);
      auVar38 = vmulps_avx512vl(auVar40,auVar69);
      auVar111 = ZEXT1664(auVar38);
      do {
        paVar17 = paVar17 + -1;
        pNVar16 = pNVar19 + -1;
        pNVar19 = pNVar19 + -1;
        bVar30 = true;
        if (pNVar16->ptr != 0xfffffffffffffff8) {
          auVar68 = ZEXT1664((undefined1  [16])*paVar17);
          local_1738 = auVar108._0_16_;
          uVar12 = vcmpps_avx512vl((undefined1  [16])*paVar17,local_1738,1);
          sVar28 = pNVar16->ptr;
          if ((char)uVar12 != '\0') {
LAB_0074aa66:
            local_1748 = auVar96._0_16_;
            local_16f8 = auVar98._0_16_;
            local_1708 = auVar100._0_16_;
            local_1758 = auVar109._0_16_;
            local_1718 = auVar103._0_16_;
            local_1768 = auVar111._0_16_;
            local_1728 = auVar107._0_16_;
            if ((sVar28 & 8) == 0) goto code_r0x0074aa70;
            if (sVar28 == 0xfffffffffffffff8) goto LAB_0074ab6f;
            uVar12 = vcmpps_avx512vl(local_1738,auVar68._0_16_,6);
            if ((char)uVar12 != '\0') {
              uVar32 = (ulong)((uint)sVar28 & 0xf);
              bVar27 = bVar25;
              if (uVar32 != 8) {
                bVar27 = bVar25 ^ 0xf;
                uVar33 = 1;
                do {
                  local_17b0.geomID = *(uint *)(((sVar28 & 0xfffffffffffffff0) - 8) + uVar33 * 8);
                  local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                  uVar5 = local_1780->mask;
                  auVar64._4_4_ = uVar5;
                  auVar64._0_4_ = uVar5;
                  auVar64._8_4_ = uVar5;
                  auVar64._12_4_ = uVar5;
                  uVar12 = vptestmd_avx512vl(auVar64,*(undefined1 (*) [16])(ray + 0x90));
                  bVar22 = (byte)uVar12 & 0xf & bVar27;
                  if (bVar22 == 0) {
                    bVar22 = 0xf;
                  }
                  else {
                    local_17b0.primID = *(uint *)(((sVar28 & 0xfffffffffffffff0) - 4) + uVar33 * 8);
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl((ulong)bVar22);
                    local_17b0.valid = (int *)&mask;
                    local_17b0.geometryUserPtr = local_1780->userPtr;
                    local_17b0.context = context->user;
                    local_17b0.N = 4;
                    local_1778 = 0;
                    local_1770 = context->args;
                    p_Var15 = local_1770->intersect;
                    if (p_Var15 == (RTCIntersectFunctionN)0x0) {
                      p_Var15 = (RTCIntersectFunctionN)
                                local_1780[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17b0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var15)(&local_17b0);
                    uVar12 = vcmpps_avx512vl((undefined1  [16])0x0,
                                             *(undefined1 (*) [16])(ray + 0x80),0xe);
                    bVar22 = (byte)uVar12 ^ 0xf;
                    auVar98 = ZEXT1664(local_16f8);
                    auVar100 = ZEXT1664(local_1708);
                    auVar103 = ZEXT1664(local_1718);
                    auVar105 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                    auVar107 = ZEXT1664(local_1728);
                    auVar108 = ZEXT1664(local_1738);
                    auVar96 = ZEXT1664(local_1748);
                    auVar109 = ZEXT1664(local_1758);
                    auVar111 = ZEXT1664(local_1768);
                  }
                  bVar27 = bVar27 & bVar22;
                } while ((bVar27 != 0) &&
                        (bVar30 = uVar33 < uVar32 - 8, uVar33 = uVar33 + 1, bVar30));
                bVar27 = bVar27 ^ 0xf;
              }
              bVar25 = bVar25 | bVar27;
              if (bVar25 != 0xf) {
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar30 = (bool)(bVar25 >> 1 & 1);
                bVar29 = (bool)(bVar25 >> 2 & 1);
                auVar108 = ZEXT1664(CONCAT412((uint)(bVar25 >> 3) * auVar38._12_4_ |
                                              (uint)!(bool)(bVar25 >> 3) * auVar108._12_4_,
                                              CONCAT48((uint)bVar29 * auVar38._8_4_ |
                                                       (uint)!bVar29 * auVar108._8_4_,
                                                       CONCAT44((uint)bVar30 * auVar38._4_4_ |
                                                                (uint)!bVar30 * auVar108._4_4_,
                                                                (uint)(bVar25 & 1) * auVar38._0_4_ |
                                                                (uint)!(bool)(bVar25 & 1) *
                                                                auVar108._0_4_))));
                goto LAB_0074ab6c;
              }
              bVar30 = true;
              goto LAB_0074ab6f;
            }
          }
LAB_0074ab6c:
          bVar30 = false;
        }
LAB_0074ab6f:
      } while (!bVar30);
      bVar25 = bVar25 & bVar24;
      bVar30 = (bool)(bVar25 >> 1 & 1);
      bVar29 = (bool)(bVar25 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar25 & 1) * -0x800000 | (uint)!(bool)(bVar25 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar30 * -0x800000 | (uint)!bVar30 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar29 * -0x800000 | (uint)!bVar29 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar25 >> 3) * -0x800000 | (uint)!(bool)(bVar25 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
code_r0x0078ec6b:
  auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + uVar18),auVar41,auVar38);
  auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + stack_node[0xa7].ptr),auVar40,
                            auVar48);
  auVar38 = vpmaxsd_avx(auVar38,auVar41);
  auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + uVar26),auVar43,auVar42);
  auVar41 = vpmaxsd_avx512vl(auVar41,auVar46);
  auVar38 = vpmaxsd_avx(auVar38,auVar41);
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar18 ^ 0x10)),auVar45,auVar37);
  auVar48 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(sVar28 + 0x20 + stack_node[0xa6].ptr),auVar79,auVar44)
  ;
  auVar41 = vpminsd_avx(auVar41,auVar48);
  auVar40 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar26 ^ 0x10)),auVar86,auVar80);
  auVar48 = vpminsd_avx512vl(auVar40,auVar47);
  auVar41 = vpminsd_avx(auVar41,auVar48);
  uVar20 = vcmpps_avx512vl(auVar38,auVar41,2);
  if ((char)uVar20 == '\0') {
    bVar30 = false;
  }
  else {
    uVar14 = 0;
    sVar21 = 8;
    do {
      lVar13 = 0;
      for (uVar32 = uVar20; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      uVar83 = *(undefined4 *)(sVar28 + 0x20 + lVar13 * 4);
      auVar66._4_4_ = uVar83;
      auVar66._0_4_ = uVar83;
      auVar66._8_4_ = uVar83;
      auVar66._12_4_ = uVar83;
      auVar42 = vfmadd132ps_avx512vl(auVar66,auVar112._0_16_,auVar111._0_16_);
      uVar83 = *(undefined4 *)(sVar28 + 0x40 + lVar13 * 4);
      auVar73._4_4_ = uVar83;
      auVar73._0_4_ = uVar83;
      auVar73._8_4_ = uVar83;
      auVar73._12_4_ = uVar83;
      auVar43 = vfmadd132ps_avx512vl(auVar73,auVar113._0_16_,auVar68._0_16_);
      uVar83 = *(undefined4 *)(sVar28 + 0x60 + lVar13 * 4);
      auVar77._4_4_ = uVar83;
      auVar77._0_4_ = uVar83;
      auVar77._8_4_ = uVar83;
      auVar77._12_4_ = uVar83;
      auVar48 = vfmadd132ps_avx512vl(auVar77,auVar114._0_16_,auVar110._0_16_);
      uVar83 = *(undefined4 *)(sVar28 + 0x30 + lVar13 * 4);
      auVar82._4_4_ = uVar83;
      auVar82._0_4_ = uVar83;
      auVar82._8_4_ = uVar83;
      auVar82._12_4_ = uVar83;
      auVar40 = vfmadd132ps_avx512vl(auVar82,auVar112._0_16_,auVar111._0_16_);
      uVar83 = *(undefined4 *)(sVar28 + 0x50 + lVar13 * 4);
      auVar87._4_4_ = uVar83;
      auVar87._0_4_ = uVar83;
      auVar87._8_4_ = uVar83;
      auVar87._12_4_ = uVar83;
      auVar37 = vfmadd132ps_avx512vl(auVar87,auVar113._0_16_,auVar68._0_16_);
      auVar103 = ZEXT1664(auVar37);
      uVar83 = *(undefined4 *)(sVar28 + 0x70 + lVar13 * 4);
      auVar91._4_4_ = uVar83;
      auVar91._0_4_ = uVar83;
      auVar91._8_4_ = uVar83;
      auVar91._12_4_ = uVar83;
      auVar45 = vfmadd132ps_avx512vl(auVar91,auVar114._0_16_,auVar110._0_16_);
      auVar105 = ZEXT1664(auVar45);
      auVar38 = vpminsd_avx(auVar42,auVar40);
      auVar41 = vpminsd_avx(auVar43,auVar37);
      auVar38 = vpmaxsd_avx(auVar38,auVar41);
      auVar41 = vpminsd_avx(auVar48,auVar45);
      auVar41 = vpmaxsd_avx512vl(auVar41,auVar115._0_16_);
      auVar108 = ZEXT1664(auVar41);
      auVar38 = vpmaxsd_avx(auVar38,auVar41);
      auVar107 = ZEXT1664(auVar38);
      auVar41 = vpmaxsd_avx(auVar42,auVar40);
      auVar42 = vpmaxsd_avx(auVar43,auVar37);
      auVar42 = vpminsd_avx(auVar41,auVar42);
      auVar41 = vpmaxsd_avx(auVar48,auVar45);
      auVar41 = vpminsd_avx512vl(auVar41,auVar36);
      auVar42 = vpminsd_avx(auVar42,auVar41);
      uVar31 = vpcmpd_avx512vl(auVar38,auVar42,2);
      uVar31 = uVar31 & 0xf;
      uVar32 = uVar14;
      sVar23 = sVar21;
      if (((char)uVar31 != '\0') &&
         (sVar23 = *(size_t *)(sVar28 + lVar13 * 8), uVar32 = uVar31, sVar21 != 8)) {
        pNVar16->ptr = sVar21;
        pNVar16[1].ptr = uVar14;
        pNVar16 = pNVar16 + 2;
      }
      uVar20 = uVar20 - 1 & uVar20;
      uVar14 = uVar32;
      sVar21 = sVar23;
    } while (uVar20 != 0);
    bVar30 = sVar23 != 8;
    sVar28 = sVar23;
  }
  auVar100 = ZEXT1664(auVar40);
  auVar98 = ZEXT1664(auVar48);
  auVar96 = ZEXT1664(auVar41);
  if (!bVar30) goto LAB_0078f0af;
  goto LAB_0078ec61;
code_r0x0074aa70:
  auVar68 = ZEXT1664(auVar105._0_16_);
  uVar32 = 0;
  sVar21 = 8;
  do {
    sVar23 = *(size_t *)((sVar28 & 0xfffffffffffffff0) + uVar32 * 8);
    if (sVar23 != 8) {
      uVar83 = *(undefined4 *)(sVar28 + 0x20 + uVar32 * 4);
      auVar75._4_4_ = uVar83;
      auVar75._0_4_ = uVar83;
      auVar75._8_4_ = uVar83;
      auVar75._12_4_ = uVar83;
      auVar48 = vfmadd132ps_fma(auVar75,local_1748,local_16f8);
      uVar83 = *(undefined4 *)(sVar28 + 0x40 + uVar32 * 4);
      auVar78._4_4_ = uVar83;
      auVar78._0_4_ = uVar83;
      auVar78._8_4_ = uVar83;
      auVar78._12_4_ = uVar83;
      auVar42 = vfmadd132ps_avx512vl(auVar78,local_1758,local_1708);
      uVar83 = *(undefined4 *)(sVar28 + 0x60 + uVar32 * 4);
      auVar85._4_4_ = uVar83;
      auVar85._0_4_ = uVar83;
      auVar85._8_4_ = uVar83;
      auVar85._12_4_ = uVar83;
      auVar43 = vfmadd132ps_avx512vl(auVar85,local_1768,local_1718);
      uVar83 = *(undefined4 *)(sVar28 + 0x30 + uVar32 * 4);
      auVar89._4_4_ = uVar83;
      auVar89._0_4_ = uVar83;
      auVar89._8_4_ = uVar83;
      auVar89._12_4_ = uVar83;
      auVar40 = vfmadd132ps_fma(auVar89,local_1748,local_16f8);
      uVar83 = *(undefined4 *)(sVar28 + 0x50 + uVar32 * 4);
      auVar92._4_4_ = uVar83;
      auVar92._0_4_ = uVar83;
      auVar92._8_4_ = uVar83;
      auVar92._12_4_ = uVar83;
      auVar36 = vfmadd132ps_avx512vl(auVar92,local_1758,local_1708);
      uVar83 = *(undefined4 *)(sVar28 + 0x70 + uVar32 * 4);
      auVar93._4_4_ = uVar83;
      auVar93._0_4_ = uVar83;
      auVar93._8_4_ = uVar83;
      auVar93._12_4_ = uVar83;
      auVar37 = vfmadd132ps_avx512vl(auVar93,local_1768,local_1718);
      auVar38 = vpminsd_avx(auVar48,auVar40);
      auVar41 = vpminsd_avx(auVar42,auVar36);
      auVar38 = vpmaxsd_avx(auVar38,auVar41);
      auVar41 = vpminsd_avx(auVar43,auVar37);
      auVar38 = vpmaxsd_avx(auVar38,auVar41);
      auVar41 = vpmaxsd_avx(auVar48,auVar40);
      auVar48 = vpmaxsd_avx(auVar42,auVar36);
      auVar40 = vpminsd_avx(auVar41,auVar48);
      auVar41 = vpmaxsd_avx(auVar43,auVar37);
      auVar48 = vpmaxsd_avx(auVar38,local_1728);
      auVar41 = vpminsd_avx(auVar41,local_1738);
      auVar41 = vpminsd_avx(auVar40,auVar41);
      uVar33 = vpcmpd_avx512vl(auVar48,auVar41,2);
      uVar33 = uVar33 & 0xf;
      if ((byte)uVar33 != 0) {
        auVar41 = vblendmps_avx512vl(auVar105._0_16_,auVar38);
        bVar29 = (bool)((byte)uVar33 & 1);
        bVar8 = (bool)((byte)(uVar33 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar33 >> 2) & 1);
        bVar9 = SUB81(uVar33 >> 3,0);
        if (sVar21 != 8) {
          pNVar19->ptr = sVar21;
          pNVar19 = pNVar19 + 1;
          *paVar17 = auVar68._0_16_;
          paVar17 = paVar17 + 1;
        }
        auVar68 = ZEXT1664(CONCAT412((uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar38._12_4_,
                                     CONCAT48((uint)bVar7 * auVar41._8_4_ |
                                              (uint)!bVar7 * auVar38._8_4_,
                                              CONCAT44((uint)bVar8 * auVar41._4_4_ |
                                                       (uint)!bVar8 * auVar38._4_4_,
                                                       (uint)bVar29 * auVar41._0_4_ |
                                                       (uint)!bVar29 * auVar38._0_4_))));
        sVar21 = sVar23;
      }
    }
  } while ((sVar23 != 8) && (bVar29 = uVar32 < 3, uVar32 = uVar32 + 1, bVar29));
  sVar28 = sVar21;
  if (sVar21 == 8) goto LAB_0074ab6c;
  goto LAB_0074aa66;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }